

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::Session(Session *this)

{
  ostream *poVar1;
  logic_error *this_00;
  allocator local_41;
  string local_40 [8];
  string msg;
  Session *this_local;
  
  NonCopyable::NonCopyable(&this->super_NonCopyable);
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Session_001ef618;
  makeCommandLineParser();
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
            (&this->m_unusedTokens);
  ConfigData::ConfigData(&this->m_configData);
  Ptr<Catch::Config>::Ptr(&this->m_config);
  if ((alreadyInstantiated & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"Only one instance of Catch::Session can ever be used",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    poVar1 = cerr();
    poVar1 = std::operator<<(poVar1,local_40);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  alreadyInstantiated = 1;
  return;
}

Assistant:

Session()
        : m_cli( makeCommandLineParser() ) {
            if( alreadyInstantiated ) {
                std::string msg = "Only one instance of Catch::Session can ever be used";
                Catch::cerr() << msg << std::endl;
                throw std::logic_error( msg );
            }
            alreadyInstantiated = true;
        }